

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void sysbvm_dwarf_cfi_stackSizeAdvance(sysbvm_dwarf_cfi_builder_t *cfi,size_t pc,size_t increment)

{
  if (((increment != 0) && (cfi->isInPrologue != false)) &&
     (cfi->stackFrameSize = cfi->stackFrameSize + (increment >> 3),
     cfi->hasFramePointerRegister == false)) {
    sysbvm_dwarf_cfi_setPC(cfi,pc);
    sysbvm_dwarf_cfi_cfaInRegisterWithOffset
              (cfi,cfi->stackPointerRegister,cfi->stackFrameSizeAtFramePointer << 3);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_stackSizeAdvance(sysbvm_dwarf_cfi_builder_t *cfi, size_t pc, size_t increment)
{
    if(!cfi->isInPrologue) return;
    if(!increment) return;
    
    cfi->stackFrameSize += increment / sizeof(uintptr_t);
    if(!cfi->hasFramePointerRegister)
    {
        sysbvm_dwarf_cfi_setPC(cfi, pc);
        sysbvm_dwarf_cfi_cfaInRegisterWithFactoredOffset(cfi, cfi->stackPointerRegister, cfi->stackFrameSizeAtFramePointer);
    }
}